

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_PluginReceivesSourceCodeInfo_Test::
~CommandLineInterfaceTest_PluginReceivesSourceCodeInfo_Test
          (CommandLineInterfaceTest_PluginReceivesSourceCodeInfo_Test *this)

{
  CommandLineInterfaceTest_PluginReceivesSourceCodeInfo_Test *this_local;
  
  ~CommandLineInterfaceTest_PluginReceivesSourceCodeInfo_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, PluginReceivesSourceCodeInfo) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message MockCodeGenerator_HasSourceCodeInfo {}\n");

  Run("protocol_compiler --plug_out=$tmpdir --proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "Saw message type MockCodeGenerator_HasSourceCodeInfo: true.");
}